

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_remove(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  REF_INT local_44;
  REF_INT local_40;
  int local_3c;
  int local_38;
  int local_30;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT parent;
  REF_INT target;
  REF_INT ref;
  REF_INT item;
  REF_INT reference_local;
  REF_INT node_local;
  REF_ADJ ref_adj_local;
  
  if ((node < 0) || (ref_adj->nnode <= node)) {
    local_38 = -1;
  }
  else {
    local_38 = ref_adj->first[node];
  }
  if (local_38 == -1) {
    ref_adj_local._4_4_ = 3;
  }
  else if (reference == ref_adj->item[local_38].ref) {
    ref_adj->first[node] = ref_adj->item[local_38].next;
    ref_adj->item[local_38].next = ref_adj->blank;
    ref_adj->blank = local_38;
    ref_adj->item[local_38].ref = -1;
    ref_adj_local._4_4_ = 0;
  }
  else {
    ref_private_macro_code_rss = -1;
    local_30 = -1;
    if ((node < 0) || (ref_adj->nnode <= node)) {
      local_3c = -1;
    }
    else {
      local_3c = ref_adj->first[node];
    }
    target = local_3c;
    if (local_3c == -1) {
      local_40 = -1;
    }
    else {
      local_40 = ref_adj->item[local_3c].ref;
    }
    parent = local_40;
    while (target != -1) {
      if (parent == reference) {
        ref_private_macro_code_rss = target;
        break;
      }
      local_30 = target;
      target = ref_adj->item[target].next;
      if (target == -1) {
        local_44 = -1;
      }
      else {
        local_44 = ref_adj->item[target].ref;
      }
      parent = local_44;
    }
    if (ref_private_macro_code_rss == -1) {
      ref_adj_local._4_4_ = 3;
    }
    else if (local_30 == -1) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0xba,
             "ref_adj_remove",1,"parent empty");
      ref_adj_local._4_4_ = 1;
    }
    else {
      ref_adj->item[local_30].next = ref_adj->item[target].next;
      ref_adj->item[target].next = ref_adj->blank;
      ref_adj->blank = target;
      ref_adj->item[target].ref = -1;
      ref_adj_local._4_4_ = 0;
    }
  }
  return ref_adj_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adj_remove(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT reference) {
  REF_INT item, ref;
  REF_INT target, parent;

  item = ref_adj_first(ref_adj, node);

  if (!ref_adj_valid(item)) return REF_INVALID;

  if (reference == ref_adj_item_ref(ref_adj, item)) {
    ref_adj->first[node] = ref_adj_item_next(ref_adj, item);
    ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
    ref_adj_blank(ref_adj) = item;
    ref_adj_item_ref(ref_adj, item) = REF_EMPTY;
    return REF_SUCCESS;
  }

  target = REF_EMPTY;
  parent = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      target = item;
      break;
    } else {
      parent = item;
    }
  }

  if (REF_EMPTY == target) return REF_INVALID;

  if (REF_EMPTY == parent) RSS(REF_FAILURE, "parent empty");

  ref_adj_item_next(ref_adj, parent) = ref_adj_item_next(ref_adj, item);
  ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = item;
  ref_adj_item_ref(ref_adj, item) = REF_EMPTY;

  return REF_SUCCESS;
}